

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O3

void __thiscall slang::OS::printE(OS *this,text_style *style,string_view text)

{
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string_view text_00;
  FILE *local_28;
  text_style *local_20;
  undefined8 local_10;
  char *local_8;
  
  local_28 = (FILE *)text._M_len;
  if (capturingOutput) {
    std::__cxx11::string::append((char *)&capturedStderr_abi_cxx11_,(ulong)local_28);
    return;
  }
  if (showColorsStderr) {
    local_10 = 2;
    local_8 = "{}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_10;
    args.desc_ = (unsigned_long_long)&local_28;
    local_20 = style;
    fmt::v9::vprint<std::basic_string_view<char,std::char_traits<char>>,char>
              (_stderr,(FILE *)this,(text_style *)&local_10,
               (basic_string_view<char,_std::char_traits<char>_> *)0xd,args);
    return;
  }
  text_00.size_ = (size_t)&stderr;
  text_00.data_ = (char *)style;
  fmt::v9::detail::print((detail *)_stderr,local_28,text_00);
  return;
}

Assistant:

void OS::printE(const fmt::text_style& style, string_view text) {
    if (capturingOutput)
        capturedStderr += text;
    else if (showColorsStderr)
        fmt::print(stderr, style, "{}"sv, text);
    else
        fmt::detail::print(stderr, fmt::detail::to_string_view(text));
}